

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

bool Minisat::updateOptions(void)

{
  long lVar1;
  int in_EAX;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  undefined1 strict;
  int *piVar7;
  char *pcVar8;
  char *pcVar9;
  char cVar10;
  int *argc;
  undefined8 uStack_40;
  int iStack_38;
  uint local_34 [2];
  int count;
  
  piVar7 = &iStack_38;
  uStack_40 = 0x1143f6;
  iStack_38 = in_EAX;
  pcVar3 = getenv("MINISAT_RUNTIME_ARGS");
  if (pcVar3 != (char *)0x0) {
    uStack_40 = 0x114407;
    pcVar3 = strdup(pcVar3);
    if (pcVar3 != (char *)0x0) {
      uStack_40 = 0x11441b;
      sVar4 = strlen(pcVar3);
      uVar5 = sVar4 * 8 + 0x1f & 0xfffffffffffffff0;
      lVar1 = -uVar5;
      argc = (int *)((long)local_34 + lVar1 + -4);
      _iStack_38 = CONCAT44(1,iStack_38);
      *(char **)((long)local_34 + (-4 - uVar5)) = "mergesat";
      pcVar8 = pcVar3 + -1;
      do {
        cVar10 = pcVar8[1];
        pcVar8 = pcVar8 + 1;
        *(undefined8 *)((long)&uStack_40 + lVar1) = 0x114462;
        iVar2 = isspace((int)cVar10);
      } while (iVar2 != 0);
      while (strict = SUB81(piVar7,0), cVar10 != '\0') {
        lVar6 = (long)(int)local_34[0];
        piVar7 = (int *)(ulong)(local_34[0] + 1);
        _iStack_38 = CONCAT44(local_34[0] + 1,iStack_38);
        *(char **)(argc + lVar6 * 2) = pcVar8;
        do {
          pcVar9 = pcVar8;
          strict = SUB81(piVar7,0);
          pcVar8 = pcVar9 + 1;
          cVar10 = *pcVar9;
          if (cVar10 == '\0') goto LAB_0011449b;
          *(undefined8 *)((long)&uStack_40 + lVar1) = 0x114488;
          iVar2 = isspace((int)cVar10);
        } while (iVar2 == 0);
        *pcVar9 = '\0';
        cVar10 = *pcVar8;
      }
LAB_0011449b:
      *(undefined8 *)((long)&uStack_40 + lVar1) = 0x1144a9;
      parseOptions((Minisat *)local_34,argc,(char **)0x0,(bool)strict);
      *(undefined8 *)((long)&uStack_40 + lVar1) = 0x1144b1;
      free(pcVar3);
    }
  }
  return false;
}

Assistant:

bool MERGESAT_NSPACE::updateOptions()
{
    if (getenv("MINISAT_RUNTIME_ARGS") == NULL) return false;

    char *args = strdup(getenv("MINISAT_RUNTIME_ARGS")); // make sure it's freed
    if (!args) return false;
    char *original_args = args;

    const size_t len = strlen(args);

    char *argv[len + 2];
    int count = 1;

    argv[0] = "mergesat";
    while (isspace(*args)) ++args;
    while (*args) {
        argv[count++] = args;                    // store current argument
        while (*args && !isspace(*args)) ++args; // skip current token
        if (!*args) break;
        *args = (char)0; // separate current token
        ++args;
    }

    parseOptions(count, argv, false);
    free(original_args);
    return false;
}